

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::UnaryUpdate<duckdb::StddevState,double,duckdb::VarPopOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  long lVar1;
  unsigned_long *puVar2;
  data_ptr_t pdVar3;
  sel_t *psVar4;
  ulong uVar5;
  ulong uVar6;
  idx_t iVar7;
  ulong uVar8;
  ulong uVar9;
  idx_t iVar10;
  unsigned_long uVar11;
  long lVar12;
  long lVar13;
  double dVar14;
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  undefined1 auVar21 [16];
  AggregateUnaryInput input_data;
  UnifiedVectorFormat local_68;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar3 = input->data;
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      puVar2 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      uVar5 = 0;
      uVar6 = 0;
      do {
        if (puVar2 == (unsigned_long *)0x0) {
          uVar11 = 0xffffffffffffffff;
        }
        else {
          uVar11 = puVar2[uVar5];
        }
        uVar8 = uVar6 + 0x40;
        if (count <= uVar6 + 0x40) {
          uVar8 = count;
        }
        uVar9 = uVar8;
        if (uVar11 != 0) {
          uVar9 = uVar6;
          if (uVar11 == 0xffffffffffffffff) {
            lVar12 = uVar8 - uVar6;
            if (uVar6 <= uVar8 && lVar12 != 0) {
              dVar14 = *(double *)(state + 8);
              dVar16 = *(double *)(state + 0x10);
              lVar13 = 0;
              do {
                lVar1 = *(long *)state + 1 + lVar13;
                dVar17 = *(double *)(pdVar3 + lVar13 * 8 + uVar6 * 8);
                dVar20 = dVar17 - dVar14;
                auVar15._8_4_ = (int)((ulong)lVar1 >> 0x20);
                auVar15._0_8_ = lVar1;
                auVar15._12_4_ = 0x45300000;
                dVar14 = dVar20 / ((auVar15._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) +
                         dVar14;
                dVar16 = dVar16 + (dVar17 - dVar14) * dVar20;
                lVar13 = lVar13 + 1;
              } while (lVar12 != lVar13);
              *(long *)state = lVar12 + *(long *)state;
              *(double *)(state + 8) = dVar14;
              *(double *)(state + 0x10) = dVar16;
              uVar9 = uVar8;
            }
          }
          else if (uVar6 < uVar8) {
            uVar9 = 0;
            do {
              if ((uVar11 >> (uVar9 & 0x3f) & 1) != 0) {
                lVar12 = *(long *)state + 1;
                *(long *)state = lVar12;
                dVar14 = *(double *)(pdVar3 + uVar9 * 8 + uVar6 * 8);
                dVar16 = dVar14 - *(double *)(state + 8);
                auVar18._8_4_ = (int)((ulong)lVar12 >> 0x20);
                auVar18._0_8_ = lVar12;
                auVar18._12_4_ = 0x45300000;
                dVar17 = dVar16 / ((auVar18._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0)) +
                         *(double *)(state + 8);
                *(double *)(state + 8) = dVar17;
                *(double *)(state + 0x10) = (dVar14 - dVar17) * dVar16 + *(double *)(state + 0x10);
              }
              uVar9 = uVar9 + 1;
            } while ((uVar6 - uVar8) + uVar9 != 0);
            uVar9 = uVar6 + uVar9;
          }
        }
        uVar6 = uVar9;
        uVar5 = uVar5 + 1;
      } while (uVar5 != count + 0x3f >> 6);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar2 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar2 == (unsigned_long *)0x0) || ((*puVar2 & 1) != 0)) {
      local_68.data = (data_ptr_t)&input->validity;
      local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (unsigned_long *)0x0;
      local_68.sel = (SelectionVector *)aggr_input_data;
      STDDevBaseOperation::ConstantOperation<double,duckdb::StddevState,duckdb::VarPopOperation>
                ((StddevState *)state,(double *)input->data,(AggregateUnaryInput *)&local_68,count);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_68);
    Vector::ToUnifiedFormat(input,count,&local_68);
    if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        dVar14 = *(double *)(state + 8);
        dVar16 = *(double *)(state + 0x10);
        iVar7 = 0;
        do {
          iVar10 = iVar7;
          if ((local_68.sel)->sel_vector != (sel_t *)0x0) {
            iVar10 = (idx_t)(local_68.sel)->sel_vector[iVar7];
          }
          lVar12 = *(long *)state + 1 + iVar7;
          dVar17 = *(double *)(local_68.data + iVar10 * 8) - dVar14;
          auVar21._8_4_ = (int)((ulong)lVar12 >> 0x20);
          auVar21._0_8_ = lVar12;
          auVar21._12_4_ = 0x45300000;
          dVar14 = dVar14 + dVar17 / ((auVar21._8_8_ - 1.9342813113834067e+25) +
                                     ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0)
                                     );
          dVar16 = dVar16 + (*(double *)(local_68.data + iVar10 * 8) - dVar14) * dVar17;
          iVar7 = iVar7 + 1;
        } while (count != iVar7);
        *(idx_t *)state = *(long *)state + count;
        *(double *)(state + 8) = dVar14;
        *(double *)(state + 0x10) = dVar16;
      }
    }
    else if (count != 0) {
      psVar4 = (local_68.sel)->sel_vector;
      iVar7 = 0;
      do {
        iVar10 = iVar7;
        if (psVar4 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar4[iVar7];
        }
        if ((local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar10 >> 6]
             >> (iVar10 & 0x3f) & 1) != 0) {
          lVar12 = *(long *)state + 1;
          *(long *)state = lVar12;
          dVar14 = *(double *)(local_68.data + iVar10 * 8);
          dVar16 = dVar14 - *(double *)(state + 8);
          auVar19._8_4_ = (int)((ulong)lVar12 >> 0x20);
          auVar19._0_8_ = lVar12;
          auVar19._12_4_ = 0x45300000;
          dVar17 = dVar16 / ((auVar19._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0)) +
                   *(double *)(state + 8);
          *(double *)(state + 8) = dVar17;
          *(double *)(state + 0x10) = (dVar14 - dVar17) * dVar16 + *(double *)(state + 0x10);
        }
        iVar7 = iVar7 + 1;
      } while (count != iVar7);
    }
    if (local_68.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}